

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# groups.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  Option *pOVar1;
  ostream *poVar2;
  int count;
  double value;
  string file;
  App app;
  allocator local_437;
  allocator local_436;
  allocator local_435;
  int local_434;
  double local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  string local_408;
  string local_3e8;
  string local_3c8 [32];
  string local_3a8;
  string local_388;
  string local_368 [32];
  string local_348;
  string local_328;
  string local_308 [32];
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  code *local_268 [2];
  code *local_258;
  code *local_250;
  AutoTimer local_248;
  App local_1f8;
  
  std::__cxx11::string::string((string *)&local_288,"This is a timer",(allocator *)&local_1f8);
  local_268[1] = (code *)0x0;
  local_268[0] = CLI::Timer::Simple;
  local_250 = CLI::std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
              ::_M_invoke;
  local_258 = CLI::std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
              ::_M_manager;
  CLI::AutoTimer::AutoTimer(&local_248,&local_288,(time_print_t *)local_268);
  CLI::AutoTimer::~AutoTimer(&local_248);
  CLI::std::_Function_base::~_Function_base((_Function_base *)local_268);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::string((string *)&local_2a8,"K3Pi goofit fitter",(allocator *)&local_428);
  CLI::App::App(&local_1f8,&local_2a8);
  std::__cxx11::string::~string((string *)&local_2a8);
  local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
  local_428._M_string_length = 0;
  local_428.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_2c8,"-f,--file,file",(allocator *)&local_430);
  std::__cxx11::string::string((string *)&local_2e8,"File name",(allocator *)&local_434);
  pOVar1 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (&local_1f8,&local_2c8,&local_428,&local_2e8);
  (pOVar1->super_OptionBase<CLI::Option>).required_ = true;
  std::__cxx11::string::string(local_308,"Important",&local_437);
  std::__cxx11::string::_M_assign((string *)pOVar1);
  std::__cxx11::string::~string(local_308);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::string((string *)&local_328,"-c,--count",(allocator *)&local_430);
  std::__cxx11::string::string((string *)&local_348,"Counter",&local_437);
  pOVar1 = CLI::App::add_flag<int,_(CLI::detail::enabler)0>
                     (&local_1f8,&local_328,&local_434,&local_348);
  (pOVar1->super_OptionBase<CLI::Option>).required_ = true;
  std::__cxx11::string::string(local_368,"Important",&local_436);
  std::__cxx11::string::_M_assign((string *)pOVar1);
  std::__cxx11::string::~string(local_368);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::string((string *)&local_388,"-d,--double",&local_437);
  std::__cxx11::string::string((string *)&local_3a8,"Some Value",&local_436);
  pOVar1 = CLI::App::add_option<double,_(CLI::detail::enabler)0>
                     (&local_1f8,&local_388,&local_430,&local_3a8);
  std::__cxx11::string::string(local_3c8,"Other",&local_435);
  std::__cxx11::string::_M_assign((string *)pOVar1);
  std::__cxx11::string::~string(local_3c8);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::__cxx11::string::~string((string *)&local_388);
  CLI::App::parse(&local_1f8,argc,argv);
  poVar2 = std::operator<<((ostream *)&std::cout,"Working on file: ");
  poVar2 = std::operator<<(poVar2,(string *)&local_428);
  poVar2 = std::operator<<(poVar2,", direct count: ");
  std::__cxx11::string::string((string *)&local_3e8,"--file",&local_437);
  CLI::App::count(&local_1f8,&local_3e8);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,", opt count: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_3e8);
  poVar2 = std::operator<<((ostream *)&std::cout,"Working on count: ");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,local_434);
  poVar2 = std::operator<<(poVar2,", direct count: ");
  std::__cxx11::string::string((string *)&local_408,"--count",&local_437);
  CLI::App::count(&local_1f8,&local_408);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,", opt count: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_408);
  std::operator<<((ostream *)&std::cout,"Some value: ");
  poVar2 = std::ostream::_M_insert<double>(local_430);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_428);
  CLI::App::~App(&local_1f8);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    CLI::AutoTimer("This is a timer");

    CLI::App app("K3Pi goofit fitter");

    std::string file;
    CLI::Option *opt = app.add_option("-f,--file,file", file, "File name")->required()->group("Important");

    int count;
    CLI::Option *copt = app.add_flag("-c,--count", count, "Counter")->required()->group("Important");

    double value; // = 3.14;
    app.add_option("-d,--double", value, "Some Value")->group("Other");

    try {
        app.parse(argc, argv);
    } catch(const CLI::ParseError &e) {
        return app.exit(e);
    }

    std::cout << "Working on file: " << file << ", direct count: " << app.count("--file")
              << ", opt count: " << opt->count() << std::endl;
    std::cout << "Working on count: " << count << ", direct count: " << app.count("--count")
              << ", opt count: " << copt->count() << std::endl;
    std::cout << "Some value: " << value << std::endl;

    return 0;
}